

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLogger::doCompression(SimpleLogger *this,size_t file_num)

{
  ulong *puVar1;
  ulong in_RSI;
  long in_RDI;
  string filename_tar;
  size_t ii;
  size_t max_log_files;
  string cmd;
  string filename;
  memory_order __b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdf8;
  string *cmd_given;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  SimpleLogger *this_00;
  char *in_stack_fffffffffffffe08;
  string *this_01;
  size_t in_stack_fffffffffffffe20;
  SimpleLogger *in_stack_fffffffffffffe28;
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  ulong local_120;
  ulong local_118;
  string local_110 [48];
  string local_e0 [32];
  string local_c0 [32];
  undefined1 local_a0 [32];
  string local_80;
  string local_60 [32];
  ulong local_40;
  ulong local_30;
  memory_order local_28;
  int local_24;
  ulong *local_20;
  int local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  int *local_8;
  
  local_40 = in_RSI;
  getLogFilePath_abi_cxx11_(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::__cxx11::string::string((string *)(local_a0 + 0x20));
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
  std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  this_01 = (string *)(local_a0 + 0x20);
  this_00 = (SimpleLogger *)local_a0;
  std::__cxx11::string::operator=(this_01,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  execCmd(this_00,in_stack_fffffffffffffdf8);
  std::operator+((char *)this_01,&this_00->filePath);
  cmd_given = (string *)(local_a0 + 0x20);
  std::__cxx11::string::operator=((string *)cmd_given,local_110);
  std::__cxx11::string::~string(local_110);
  execCmd(this_00,cmd_given);
  puVar1 = (ulong *)(in_RDI + 0x30);
  local_24 = 5;
  local_20 = puVar1;
  local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_24 - 1U < 2) {
    local_30 = *puVar1;
  }
  else if (local_24 == 5) {
    local_30 = *puVar1;
  }
  else {
    local_30 = *puVar1;
  }
  local_118 = local_30;
  if ((local_30 != 0) && (local_30 <= local_40)) {
    for (local_120 = *(ulong *)(in_RDI + 0x20); local_120 <= local_40 - local_118;
        local_120 = local_120 + 1) {
      getLogFilePath_abi_cxx11_(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::__cxx11::string::operator=(local_60,local_140);
      std::__cxx11::string::~string(local_140);
      getLogFilePath_abi_cxx11_(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_180);
      std::operator+((char *)this_01,&this_00->filePath);
      std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
      std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffdc8 = &local_1a0;
      std::__cxx11::string::operator=
                ((string *)(local_a0 + 0x20),(string *)in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe20);
      execCmd(this_00,cmd_given);
      *(ulong *)(in_RDI + 0x20) = local_120 + 1;
      std::__cxx11::string::~string(local_160);
    }
  }
  local_8 = (int *)(in_RDI + 0x240);
  local_c = 1;
  local_10 = 5;
  local_14 = 1;
  LOCK();
  local_18 = *local_8;
  *local_8 = *local_8 + -1;
  UNLOCK();
  std::__cxx11::string::~string((string *)(local_a0 + 0x20));
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void SimpleLogger::doCompression(size_t file_num) {
#if defined(__linux__) || defined(__APPLE__)
    std::string filename = getLogFilePath(file_num);
    std::string cmd;
    cmd = "tar zcvf " + filename + ".tar.gz " + filename;
    execCmd(cmd);

    cmd = "rm -f " + filename;
    execCmd(cmd);

    size_t max_log_files = maxLogFiles.load();
    // Remove previous log files.
    if (max_log_files && file_num >= max_log_files) {
        for (size_t ii=minRevnum; ii<=file_num-max_log_files; ++ii) {
            filename = getLogFilePath(ii);
            std::string filename_tar = getLogFilePath(ii) + ".tar.gz";
            cmd = "rm -f " + filename + " " + filename_tar;
            execCmd(cmd);
            minRevnum = ii+1;
        }
    }
#endif

    numCompJobs.fetch_sub(1);
}